

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::favoritesCB(Fl_File_Chooser *this,Fl_Widget *w)

{
  Fl_File_Browser *pFVar1;
  Fl_Preferences *this_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  Fl_File_Icon *d;
  char *pcVar5;
  fd_set *pfVar6;
  fd_set *in_R8;
  timeval *in_R9;
  char local_448 [8];
  char pathname [1024];
  char name [32];
  uint local_1c;
  int i;
  Fl_Widget *w_local;
  Fl_File_Chooser *this_local;
  
  if (w == (Fl_Widget *)0x0) {
    Fl_Browser::clear(&this->favList->super_Fl_Browser);
    Fl_Browser_::deselect((Fl_Browser_ *)this->favList,0);
    for (local_1c = 0; (int)local_1c < 100; local_1c = local_1c + 1) {
      sprintf(pathname + 0x3f8,"favorite%02d",(ulong)local_1c);
      Fl_Preferences::get(prefs_,pathname + 0x3f8,local_448,"",0x400);
      if (local_448[0] == '\0') break;
      pFVar1 = this->favList;
      d = Fl_File_Icon::find(local_448,5);
      Fl_Browser::add(&pFVar1->super_Fl_Browser,local_448,d);
    }
    Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
    Fl_Widget::deactivate(&this->favDeleteButton->super_Fl_Widget);
    Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
    Fl_Widget::deactivate((Fl_Widget *)this->favOkButton);
    Fl_Window::hotspot(&this->favWindow->super_Fl_Window,(Fl_Widget *)this->favList,0);
    (*(this->favWindow->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  }
  else if ((Fl_File_Browser *)w == this->favList) {
    iVar2 = Fl_Browser::value(&this->favList->super_Fl_Browser);
    if (iVar2 == 0) {
      Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
      Fl_Widget::deactivate(&this->favDeleteButton->super_Fl_Widget);
      Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
    }
    else {
      if (iVar2 < 2) {
        Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
      }
      else {
        Fl_Widget::activate(&this->favUpButton->super_Fl_Widget);
      }
      Fl_Widget::activate(&this->favDeleteButton->super_Fl_Widget);
      iVar3 = Fl_Browser::size(&this->favList->super_Fl_Browser);
      if (iVar2 < iVar3) {
        Fl_Widget::activate(&this->favDownButton->super_Fl_Widget);
      }
      else {
        Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
      }
    }
  }
  else if ((Fl_Button *)w == this->favUpButton) {
    iVar2 = Fl_Browser::value(&this->favList->super_Fl_Browser);
    pFVar1 = this->favList;
    pcVar5 = Fl_Browser::text(&this->favList->super_Fl_Browser,iVar2);
    pfVar6 = (fd_set *)Fl_Browser::data(&this->favList->super_Fl_Browser,iVar2);
    Fl_Browser::insert(&pFVar1->super_Fl_Browser,iVar2 + -1,pcVar5,pfVar6);
    Fl_Browser::remove(&this->favList->super_Fl_Browser,(char *)(ulong)(iVar2 + 1));
    Fl_Browser::select(&this->favList->super_Fl_Browser,iVar2 + -1,(fd_set *)&DAT_00000001,pfVar6,
                       in_R8,in_R9);
    if (iVar2 == 2) {
      Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
    }
    Fl_Widget::activate(&this->favDownButton->super_Fl_Widget);
    Fl_Widget::activate((Fl_Widget *)this->favOkButton);
  }
  else if ((Fl_Button *)w == this->favDeleteButton) {
    local_1c = Fl_Browser::value(&this->favList->super_Fl_Browser);
    Fl_Browser::remove(&this->favList->super_Fl_Browser,(char *)(ulong)local_1c);
    uVar4 = Fl_Browser::size(&this->favList->super_Fl_Browser);
    if ((int)uVar4 < (int)local_1c) {
      local_1c = local_1c - 1;
    }
    Fl_Browser::select(&this->favList->super_Fl_Browser,local_1c,(fd_set *)&DAT_00000001,
                       (fd_set *)(ulong)uVar4,in_R8,in_R9);
    iVar2 = Fl_Browser::size(&this->favList->super_Fl_Browser);
    if ((int)local_1c < iVar2) {
      Fl_Widget::activate(&this->favDownButton->super_Fl_Widget);
    }
    else {
      Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
    }
    if ((int)local_1c < 2) {
      Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
    }
    else {
      Fl_Widget::activate(&this->favUpButton->super_Fl_Widget);
    }
    if (local_1c == 0) {
      Fl_Widget::deactivate(&this->favDeleteButton->super_Fl_Widget);
    }
    Fl_Widget::activate((Fl_Widget *)this->favOkButton);
  }
  else if ((Fl_Button *)w == this->favDownButton) {
    uVar4 = Fl_Browser::value(&this->favList->super_Fl_Browser);
    pFVar1 = this->favList;
    pcVar5 = Fl_Browser::text(&this->favList->super_Fl_Browser,uVar4);
    pfVar6 = (fd_set *)Fl_Browser::data(&this->favList->super_Fl_Browser,uVar4);
    Fl_Browser::insert(&pFVar1->super_Fl_Browser,uVar4 + 2,pcVar5,pfVar6);
    Fl_Browser::remove(&this->favList->super_Fl_Browser,(char *)(ulong)uVar4);
    Fl_Browser::select(&this->favList->super_Fl_Browser,uVar4 + 1,(fd_set *)&DAT_00000001,pfVar6,
                       in_R8,in_R9);
    iVar2 = Fl_Browser::size(&this->favList->super_Fl_Browser);
    if (uVar4 + 1 == iVar2) {
      Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
    }
    Fl_Widget::activate(&this->favUpButton->super_Fl_Widget);
    Fl_Widget::activate((Fl_Widget *)this->favOkButton);
  }
  else if (w == (Fl_Widget *)this->favOkButton) {
    for (local_1c = 0; iVar2 = Fl_Browser::size(&this->favList->super_Fl_Browser),
        (int)local_1c < iVar2; local_1c = local_1c + 1) {
      sprintf(pathname + 0x3f8,"favorite%02d",(ulong)local_1c);
      this_00 = prefs_;
      pcVar5 = Fl_Browser::text(&this->favList->super_Fl_Browser,local_1c + 1);
      Fl_Preferences::set(this_00,pathname + 0x3f8,pcVar5);
    }
    for (; (int)local_1c < 100; local_1c = local_1c + 1) {
      sprintf(pathname + 0x3f8,"favorite%02d",(ulong)local_1c);
      Fl_Preferences::get(prefs_,pathname + 0x3f8,local_448,"",0x400);
      if (local_448[0] == '\0') break;
      Fl_Preferences::set(prefs_,pathname + 0x3f8,"");
    }
    update_favorites(this);
    Fl_Preferences::flush(prefs_);
    (*(this->favWindow->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  }
  return;
}

Assistant:

void
Fl_File_Chooser::favoritesCB(Fl_Widget *w)
					// I - Widget
{
  int		i;			// Looping var
  char		name[32],		// Preference name
		pathname[1024];		// Directory in list


  if (!w) {
    // Load the favorites list...
    favList->clear();
    favList->deselect();

    for (i = 0; i < 100; i ++) {
      // Get favorite directory 0 to 99...
      sprintf(name, "favorite%02d", i);

      prefs_->get(name, pathname, "", sizeof(pathname));

      // Stop on the first empty favorite...
      if (!pathname[0]) break;

      // Add the favorite to the list...
      favList->add(pathname,
                   Fl_File_Icon::find(pathname, Fl_File_Icon::DIRECTORY));
    }

    favUpButton->deactivate();
    favDeleteButton->deactivate();
    favDownButton->deactivate();
    favOkButton->deactivate();

    favWindow->hotspot(favList);
    favWindow->show();
  } else if (w == favList) {
    i = favList->value();
    if (i) {
      if (i > 1) favUpButton->activate();
      else favUpButton->deactivate();

      favDeleteButton->activate();

      if (i < favList->size()) favDownButton->activate();
      else favDownButton->deactivate();
    } else {
      favUpButton->deactivate();
      favDeleteButton->deactivate();
      favDownButton->deactivate();
    }
  } else if (w == favUpButton) {
    i = favList->value();

    favList->insert(i - 1, favList->text(i), favList->data(i));
    favList->remove(i + 1);
    favList->select(i - 1);

    if (i == 2) favUpButton->deactivate();

    favDownButton->activate();

    favOkButton->activate();
  } else if (w == favDeleteButton) {
    i = favList->value();

    favList->remove(i);

    if (i > favList->size()) i --;
    favList->select(i);

    if (i < favList->size()) favDownButton->activate();
    else favDownButton->deactivate();

    if (i > 1) favUpButton->activate();
    else favUpButton->deactivate();

    if (!i) favDeleteButton->deactivate();

    favOkButton->activate();
  } else if (w == favDownButton) {
    i = favList->value();

    favList->insert(i + 2, favList->text(i), favList->data(i));
    favList->remove(i);
    favList->select(i + 1);

    if ((i + 1) == favList->size()) favDownButton->deactivate();

    favUpButton->activate();

    favOkButton->activate();
  } else if (w == favOkButton) {
    // Copy the new list over...
    for (i = 0; i < favList->size(); i ++) {
      // Set favorite directory 0 to 99...
      sprintf(name, "favorite%02d", i);

      prefs_->set(name, favList->text(i + 1));
    }

    // Clear old entries as necessary...
    for (; i < 100; i ++) {
      // Clear favorite directory 0 to 99...
      sprintf(name, "favorite%02d", i);

      prefs_->get(name, pathname, "", sizeof(pathname));

      if (pathname[0]) prefs_->set(name, "");
      else break;
    }

    update_favorites();
    prefs_->flush();

    favWindow->hide();
  }
}